

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O1

Vec_Int_t * Abc_NtkGetNodeAttributes2(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pNode;
  int iVar1;
  Vec_Int_t *vAttrs;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  
  iVar1 = Abc_NtkIsDfsOrdered(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsDfsOrdered(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCut.c"
                  ,0x2a6,"Vec_Int_t *Abc_NtkGetNodeAttributes2(Abc_Ntk_t *)");
  }
  uVar6 = (ulong)pNtk->vObjs->nSize;
  lVar4 = uVar6 + 1;
  vAttrs = (Vec_Int_t *)malloc(0x10);
  iVar5 = (int)lVar4;
  iVar1 = 0x10;
  if (0xe < uVar6) {
    iVar1 = iVar5;
  }
  vAttrs->nSize = 0;
  vAttrs->nCap = iVar1;
  if (iVar1 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar1 << 2);
  }
  vAttrs->pArray = piVar2;
  vAttrs->nSize = iVar5;
  if (piVar2 != (int *)0x0) {
    memset(piVar2,0,lVar4 * 4);
  }
  pVVar3 = pNtk->vObjs;
  if (0 < pVVar3->nSize) {
    lVar4 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar3->pArray[lVar4];
      if ((((pNode != (Abc_Obj_t *)0x0) && (pNode->Id != 0)) &&
          ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) && (1 < (pNode->vFanouts).nSize)) {
        iVar1 = Abc_NodeIsMuxControlType(pNode);
        if (iVar1 == 0) {
          if ((pNtk->vTravIds).pArray == (int *)0x0) {
            iVar1 = pNtk->vObjs->nSize;
            uVar6 = (long)iVar1 + 500;
            iVar5 = (int)uVar6;
            if ((pNtk->vTravIds).nCap < iVar5) {
              piVar2 = (int *)malloc(uVar6 * 4);
              (pNtk->vTravIds).pArray = piVar2;
              if (piVar2 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              (pNtk->vTravIds).nCap = iVar5;
            }
            if (-500 < iVar1) {
              memset((pNtk->vTravIds).pArray,0,(uVar6 & 0xffffffff) << 2);
            }
            (pNtk->vTravIds).nSize = iVar5;
          }
          iVar1 = pNtk->nTravIds;
          pNtk->nTravIds = iVar1 + 1;
          if (0x3ffffffe < iVar1) {
            __assert_fail("p->nTravIds < (1<<30)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                          ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
          }
          iVar1 = Abc_NtkSubDagSize_rec(pNode,vAttrs);
          if (0xf < iVar1) {
            iVar1 = pNode->Id;
            if (((long)iVar1 < 0) || (vAttrs->nSize <= iVar1)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            vAttrs->pArray[iVar1] = 1;
          }
        }
      }
      lVar4 = lVar4 + 1;
      pVVar3 = pNtk->vObjs;
    } while (lVar4 < pVVar3->nSize);
  }
  return vAttrs;
}

Assistant:

Vec_Int_t * Abc_NtkGetNodeAttributes2( Abc_Ntk_t * pNtk ) 
{
    Vec_Int_t * vAttrs;
    Abc_Obj_t * pObj;
    int i, nSize;
    assert( Abc_NtkIsDfsOrdered(pNtk) );
    vAttrs = Vec_IntStart( Abc_NtkObjNumMax(pNtk) + 1 );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        // skip no-nodes and nodes without fanouts
        if ( pObj->Id == 0 || !(Abc_ObjIsNode(pObj) && Abc_ObjFanoutNum(pObj) > 1 && !Abc_NodeIsMuxControlType(pObj)) )
            continue;
        // the node has more than one fanout - count its sub-DAG size
        Abc_NtkIncrementTravId( pNtk );
        nSize = Abc_NtkSubDagSize_rec( pObj, vAttrs );
        if ( nSize > 15 )
            Vec_IntWriteEntry( vAttrs, pObj->Id, 1 );
    }
    return vAttrs; 
}